

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::BitwiseNotFun::GetFunctions(void)

{
  LogicalTypeId LVar1;
  pointer pSVar2;
  LogicalType varargs;
  LogicalType varargs_00;
  NotImplementedException *this;
  ScalarFunction *function;
  pointer function_00;
  ScalarFunctionSet *in_RDI;
  pointer other;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffb74;
  undefined4 in_stack_fffffffffffffb7c;
  FunctionNullHandling in_stack_fffffffffffffb88;
  allocator_type local_471;
  ScalarFunctionSet *bind_lambda;
  undefined1 local_468 [32];
  scalar_function_t local_448;
  _Any_data local_428;
  code *local_418;
  undefined8 uStack_410;
  _func_int **local_408;
  vector<duckdb::ScalarFunction,_true> *local_400;
  LogicalType *local_3f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3f0;
  LogicalType local_3d8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3c0;
  LogicalType local_3a8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_390;
  LogicalType local_378;
  LogicalType local_360;
  LogicalType local_348;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::Integral();
  local_3f8 = local_3f0.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_3f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_3f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_400 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
    local_408 = (_func_int **)&PTR__ScalarFunction_01998f18;
    other = local_3f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start;
    do {
      LogicalType::LogicalType(&local_348,other);
      __l._M_len = 1;
      __l._M_array = &local_348;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_390,__l,&local_471);
      LogicalType::LogicalType(&local_3a8,other);
      local_418 = (code *)0x0;
      uStack_410 = 0;
      local_428._M_unused._M_object = (void *)0x0;
      local_428._8_8_ = 0;
      LVar1 = other->id_;
      if (LVar1 < UTINYINT) {
        switch(LVar1) {
        case TINYINT:
          local_468._0_8_ =
               ScalarFunction::UnaryFunction<signed_char,signed_char,duckdb::BitwiseNotOperator>;
          break;
        case SMALLINT:
          local_468._0_8_ = ScalarFunction::UnaryFunction<short,short,duckdb::BitwiseNotOperator>;
          break;
        case INTEGER:
          local_468._0_8_ = ScalarFunction::UnaryFunction<int,int,duckdb::BitwiseNotOperator>;
          break;
        case BIGINT:
          local_468._0_8_ = ScalarFunction::UnaryFunction<long,long,duckdb::BitwiseNotOperator>;
          break;
        default:
switchD_01020a12_default:
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_468._0_8_ = local_468 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,"Unimplemented type for GetScalarIntegerUnaryFunction","");
          NotImplementedException::NotImplementedException(this,(string *)local_468);
          __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        switch(LVar1) {
        case UTINYINT:
          local_468._0_8_ =
               ScalarFunction::UnaryFunction<unsigned_char,unsigned_char,duckdb::BitwiseNotOperator>
          ;
          break;
        case USMALLINT:
          local_468._0_8_ =
               ScalarFunction::
               UnaryFunction<unsigned_short,unsigned_short,duckdb::BitwiseNotOperator>;
          break;
        case UINTEGER:
          local_468._0_8_ =
               ScalarFunction::UnaryFunction<unsigned_int,unsigned_int,duckdb::BitwiseNotOperator>;
          break;
        case UBIGINT:
          local_468._0_8_ =
               ScalarFunction::UnaryFunction<unsigned_long,unsigned_long,duckdb::BitwiseNotOperator>
          ;
          break;
        default:
          if (LVar1 == UHUGEINT) {
            local_468._0_8_ =
                 ScalarFunction::
                 UnaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BitwiseNotOperator>;
          }
          else {
            if (LVar1 != HUGEINT) goto switchD_01020a12_default;
            local_468._0_8_ =
                 ScalarFunction::
                 UnaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BitwiseNotOperator>;
          }
        }
      }
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                 local_428._M_pod_data,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)local_468);
      LogicalType::LogicalType(&local_360,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_360;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffb74;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffb7c;
      ScalarFunction::ScalarFunction
                (&local_208,(vector<duckdb::LogicalType,_true> *)&local_390,&local_3a8,
                 (scalar_function_t *)&local_428,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffb88,
                 (bind_lambda_function_t)in_RDI);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&local_400->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_208);
      local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           local_408;
      if (local_208.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_208.function_info.internal.
                   super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_208.function.super__Function_base._M_manager)
                  ((_Any_data *)&local_208.function,(_Any_data *)&local_208.function,
                   __destroy_functor);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
      LogicalType::~LogicalType(&local_360);
      if (local_418 != (code *)0x0) {
        (*local_418)(&local_428,&local_428,__destroy_functor);
      }
      LogicalType::~LogicalType(&local_3a8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_390);
      LogicalType::~LogicalType(&local_348);
      other = other + 1;
    } while (other != local_3f8);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3f0);
  LogicalType::LogicalType((LogicalType *)local_468,BIT);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_468;
  bind_lambda = in_RDI;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3c0,__l_00,(allocator_type *)&local_3f0);
  LogicalType::LogicalType(&local_3d8,BIT);
  local_448.super__Function_base._M_functor._8_8_ = 0;
  local_448.super__Function_base._M_functor._M_unused._M_object = BitwiseNOTOperation;
  local_448._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_448.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_378,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_378;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffb74;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffb7c;
  ScalarFunction::ScalarFunction
            (&local_330,(vector<duckdb::LogicalType,_true> *)&local_3c0,&local_3d8,&local_448,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffffb88,(bind_lambda_function_t)bind_lambda);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_330);
  local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)&local_330.function,(_Any_data *)&local_330.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_378);
  if (local_448.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_448.super__Function_base._M_manager)
              ((_Any_data *)&local_448,(_Any_data *)&local_448,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_3d8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3c0);
  LogicalType::~LogicalType((LogicalType *)local_468);
  function_00 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function_00 != pSVar2) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function_00->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function_00 = function_00 + 1;
    } while (function_00 != pSVar2);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet BitwiseNotFun::GetFunctions() {
	ScalarFunctionSet functions;
	for (auto &type : LogicalType::Integral()) {
		functions.AddFunction(ScalarFunction({type}, type, GetScalarIntegerUnaryFunction<BitwiseNotOperator>(type)));
	}
	functions.AddFunction(ScalarFunction({LogicalType::BIT}, LogicalType::BIT, BitwiseNOTOperation));
	for (auto &function : functions.functions) {
		BaseScalarFunction::SetReturnsError(function);
	}
	return functions;
}